

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O1

void __thiscall
Equality_importSourceNotEqualInvalidInput_Test::TestBody
          (Equality_importSourceNotEqualInvalidInput_Test *this)

{
  string *psVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  ImportSourcePtr is1;
  long *local_60;
  AssertionResult local_58;
  long local_48 [2];
  AssertHelper local_38 [8];
  byte local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  string *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::ImportSource::create();
  psVar1 = local_20;
  local_58._0_8_ = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"a_great_url","");
  libcellml::ImportSource::setUrl(psVar1);
  if ((long *)local_58._0_8_ != local_48) {
    operator_delete((void *)local_58._0_8_,local_48[0] + 1);
  }
  local_58._0_8_ = (long *)0x0;
  local_58.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_30[0] = libcellml::Entity::equals((shared_ptr *)local_20);
  local_30[0] = local_30[0] ^ 1;
  local_28.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.message_.ptr_);
  }
  if (local_30[0] == 0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,(char *)local_30,"is1->equals(nullptr)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x335,(char *)local_58._0_8_);
    testing::internal::AssertHelper::operator=(local_38,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(local_38);
    if ((long *)local_58._0_8_ != local_48) {
      operator_delete((void *)local_58._0_8_,local_48[0] + 1);
    }
    if (local_60 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_60 != (long *)0x0)) {
        (**(code **)(*local_60 + 8))();
      }
      local_60 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

TEST(Equality, importSourceNotEqualInvalidInput)
{
    libcellml::ImportSourcePtr is1 = libcellml::ImportSource::create();

    is1->setUrl("a_great_url");

    EXPECT_FALSE(is1->equals(nullptr));
}